

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::FromYa::setFrameBuffer
          (FromYa *this,Rgba *base,size_t xStride,size_t yStride,string *channelNamePrefix)

{
  Rgba *pRVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  FrameBuffer fb;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffecc;
  FrameBuffer *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string local_e0 [32];
  Slice local_c0;
  string local_78 [88];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x60) == 0) {
    FrameBuffer::FrameBuffer((FrameBuffer *)0x24cc34);
    std::operator+(in_stack_fffffffffffffee8,in_RDI);
    pRVar1 = Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),0);
    uVar3 = 1;
    uVar2 = 1;
    Slice::Slice(&local_c0,HALF,(char *)&pRVar1->g,8,(ulong)*(uint *)(in_RDI + 0x30) << 3,1,1,0.0,
                 true,true);
    FrameBuffer::insert(in_stack_fffffffffffffed0,
                        (string *)CONCAT44(in_stack_fffffffffffffecc,uVar3),
                        (Slice *)CONCAT44(in_stack_fffffffffffffec4,uVar2));
    std::__cxx11::string::~string(local_78);
    std::operator+(in_stack_fffffffffffffee8,in_RDI);
    pRVar1 = Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),0);
    uVar3 = 1;
    uVar2 = 1;
    Slice::Slice((Slice *)&stack0xfffffffffffffee8,HALF,(char *)&pRVar1->a,8,
                 (ulong)*(uint *)(in_RDI + 0x30) << 3,1,1,1.0,true,true);
    FrameBuffer::insert((FrameBuffer *)pRVar1,(string *)CONCAT44(in_stack_fffffffffffffecc,uVar3),
                        (Slice *)CONCAT44(in_stack_fffffffffffffec4,uVar2));
    std::__cxx11::string::~string(local_e0);
    TiledInputFile::setFrameBuffer((TiledInputFile *)xStride,(FrameBuffer *)yStride);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x24cdb3);
  }
  *(undefined8 *)(in_RDI + 0x60) = local_10;
  *(undefined8 *)(in_RDI + 0x68) = local_18;
  *(undefined8 *)(in_RDI + 0x70) = local_20;
  return;
}

Assistant:

void
TiledRgbaInputFile::FromYa::setFrameBuffer (
    Rgba* base, size_t xStride, size_t yStride, const string& channelNamePrefix)
{
    if (_fbBase == 0)
    {
        FrameBuffer fb;

        fb.insert (
            channelNamePrefix + "Y",
            Slice (
                HALF,                       // type
                (char*) &_buf[0][0].g,      // base
                sizeof (Rgba),              // xStride
                sizeof (Rgba) * _tileXSize, // yStride
                1,
                1,   // sampling
                0.0, // fillValue
                true,
                true)); // tileCoordinates

        fb.insert (
            channelNamePrefix + "A",
            Slice (
                HALF,                       // type
                (char*) &_buf[0][0].a,      // base
                sizeof (Rgba),              // xStride
                sizeof (Rgba) * _tileXSize, // yStride
                1,
                1,   // sampling
                1.0, // fillValue
                true,
                true)); // tileCoordinates

        _inputFile.setFrameBuffer (fb);
    }

    _fbBase    = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}